

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc.c
# Opt level: O0

utf8proc_ssize_t
utf8proc_decompose_custom
          (utf8proc_uint8_t *str,utf8proc_ssize_t strlen,utf8proc_int32_t *buffer,
          utf8proc_ssize_t bufsize,utf8proc_option_t options,utf8proc_custom_func custom_func,
          void *custom_data)

{
  utf8proc_int32_t uc_00;
  utf8proc_ssize_t uVar1;
  utf8proc_property_t *puVar2;
  utf8proc_property_t *puVar3;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  code *in_R9;
  undefined8 in_stack_00000008;
  utf8proc_property_t *property2;
  utf8proc_property_t *property1;
  utf8proc_int32_t uc2;
  utf8proc_int32_t uc1;
  utf8proc_ssize_t pos;
  int boundclass;
  utf8proc_ssize_t decomp_result;
  utf8proc_ssize_t rpos;
  utf8proc_int32_t uc;
  utf8proc_ssize_t wpos;
  int *in_stack_ffffffffffffff88;
  utf8proc_option_t in_stack_ffffffffffffff94;
  utf8proc_int32_t uVar4;
  utf8proc_ssize_t in_stack_ffffffffffffff98;
  long lVar5;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 uVar6;
  utf8proc_ssize_t in_stack_ffffffffffffffa8;
  long local_50;
  int local_44;
  long local_40;
  code *local_38;
  uint local_2c;
  long local_28;
  long local_20;
  long local_18;
  long local_10;
  utf8proc_ssize_t local_8;
  
  local_40 = 0;
  if (((in_R8D & 8) == 0) || ((in_R8D & 0x10) == 0)) {
    if (((in_R8D & 0x2000) == 0) || (((in_R8D & 8) != 0 || ((in_R8D & 0x10) != 0)))) {
      local_50 = 0;
      uVar6 = 0;
      local_38 = in_R9;
      local_2c = in_R8D;
      local_28 = in_RCX;
      local_20 = in_RDX;
      local_18 = in_RSI;
      local_10 = in_RDI;
      do {
        uVar4 = (utf8proc_int32_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
        if ((local_2c & 1) == 0) {
          if (local_18 <= local_50) goto LAB_009bc7a5;
          uVar1 = utf8proc_iterate((utf8proc_uint8_t *)(local_10 + local_50),local_18 - local_50,
                                   &local_44);
          local_50 = uVar1 + local_50;
          if (local_44 < 0) {
            return -3;
          }
        }
        else {
          uVar1 = utf8proc_iterate((utf8proc_uint8_t *)(local_10 + local_50),-1,&local_44);
          local_50 = uVar1 + local_50;
          if (local_44 < 0) {
            return -3;
          }
          if (local_50 < 0) {
            return -2;
          }
          if (local_44 == 0) {
LAB_009bc7a5:
            if (((local_2c & 0x18) != 0) && (local_40 <= local_28)) {
              lVar5 = 0;
              while (lVar5 < local_40 + -1) {
                uVar4 = *(utf8proc_int32_t *)(local_20 + lVar5 * 4);
                uc_00 = *(utf8proc_int32_t *)(local_20 + 4 + lVar5 * 4);
                puVar2 = unsafe_get_property(uVar4);
                puVar3 = unsafe_get_property(uc_00);
                if ((puVar3->combining_class < puVar2->combining_class) &&
                   (0 < puVar3->combining_class)) {
                  *(utf8proc_int32_t *)(local_20 + lVar5 * 4) = uc_00;
                  *(utf8proc_int32_t *)(local_20 + 4 + lVar5 * 4) = uVar4;
                  if (lVar5 < 1) {
                    lVar5 = lVar5 + 1;
                  }
                  else {
                    lVar5 = lVar5 + -1;
                  }
                }
                else {
                  lVar5 = lVar5 + 1;
                }
              }
            }
            return local_40;
          }
        }
        if (local_38 != (code *)0x0) {
          local_44 = (*local_38)(local_44,in_stack_00000008);
        }
        in_stack_ffffffffffffffa8 =
             utf8proc_decompose_char
                       (uVar4,(utf8proc_int32_t *)CONCAT44(uVar6,in_stack_ffffffffffffffa0),
                        in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                        in_stack_ffffffffffffff88);
        if (in_stack_ffffffffffffffa8 < 0) {
          return in_stack_ffffffffffffffa8;
        }
        local_40 = in_stack_ffffffffffffffa8 + local_40;
      } while ((-1 < local_40) && (local_40 < 0x1000000000000000));
      local_8 = -2;
    }
    else {
      local_8 = -5;
    }
  }
  else {
    local_8 = -5;
  }
  return local_8;
}

Assistant:

UTF8PROC_DLLEXPORT utf8proc_ssize_t utf8proc_decompose_custom(
  const utf8proc_uint8_t *str, utf8proc_ssize_t strlen,
  utf8proc_int32_t *buffer, utf8proc_ssize_t bufsize, utf8proc_option_t options,
  utf8proc_custom_func custom_func, void *custom_data
) {
  /* strlen will be ignored, if UTF8PROC_NULLTERM is set in options */
  utf8proc_ssize_t wpos = 0;
  if ((options & UTF8PROC_COMPOSE) && (options & UTF8PROC_DECOMPOSE))
    return UTF8PROC_ERROR_INVALIDOPTS;
  if ((options & UTF8PROC_STRIPMARK) &&
      !(options & UTF8PROC_COMPOSE) && !(options & UTF8PROC_DECOMPOSE))
    return UTF8PROC_ERROR_INVALIDOPTS;
  {
    utf8proc_int32_t uc;
    utf8proc_ssize_t rpos = 0;
    utf8proc_ssize_t decomp_result;
    int boundclass = UTF8PROC_BOUNDCLASS_START;
    while (1) {
      if (options & UTF8PROC_NULLTERM) {
        rpos += utf8proc_iterate(str + rpos, -1, &uc);
        /* checking of return value is not necessary,
           as 'uc' is < 0 in case of error */
        if (uc < 0) return UTF8PROC_ERROR_INVALIDUTF8;
        if (rpos < 0) return UTF8PROC_ERROR_OVERFLOW;
        if (uc == 0) break;
      } else {
        if (rpos >= strlen) break;
        rpos += utf8proc_iterate(str + rpos, strlen - rpos, &uc);
        if (uc < 0) return UTF8PROC_ERROR_INVALIDUTF8;
      }
      if (custom_func != NULL) {
        uc = custom_func(uc, custom_data);   /* user-specified custom mapping */
      }
      decomp_result = utf8proc_decompose_char(
        uc, buffer + wpos, (bufsize > wpos) ? (bufsize - wpos) : 0, options,
        &boundclass
      );
      if (decomp_result < 0) return decomp_result;
      wpos += decomp_result;
      /* prohibiting integer overflows due to too long strings: */
      if (wpos < 0 ||
          wpos > (utf8proc_ssize_t)(SSIZE_MAX/sizeof(utf8proc_int32_t)/2))
        return UTF8PROC_ERROR_OVERFLOW;
    }
  }
  if ((options & (UTF8PROC_COMPOSE|UTF8PROC_DECOMPOSE)) && bufsize >= wpos) {
    utf8proc_ssize_t pos = 0;
    while (pos < wpos-1) {
      utf8proc_int32_t uc1, uc2;
      const utf8proc_property_t *property1, *property2;
      uc1 = buffer[pos];
      uc2 = buffer[pos+1];
      property1 = unsafe_get_property(uc1);
      property2 = unsafe_get_property(uc2);
      if (property1->combining_class > property2->combining_class &&
          property2->combining_class > 0) {
        buffer[pos] = uc2;
        buffer[pos+1] = uc1;
        if (pos > 0) pos--; else pos++;
      } else {
        pos++;
      }
    }
  }
  return wpos;
}